

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void __thiscall Provider::Provider(Provider *this,shared_ptr<Buffer> *b)

{
  shared_ptr<Buffer> *b_local;
  Provider *this_local;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__Provider_0018d8d8;
  std::shared_ptr<Buffer>::shared_ptr(&this->b,b);
  this->bad_length = false;
  return;
}

Assistant:

Provider(std::shared_ptr<Buffer> b) :
        b(b)
    {
    }